

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

uint __thiscall IRBuilder::AddStatementBoundary(IRBuilder *this,uint statementIndex,uint offset)

{
  bool bVar1;
  BOOL BVar2;
  uint byteCodeOffset;
  uint32 uVar3;
  PragmaInstr *instr;
  JITTimeFunctionBody *pJVar4;
  FunctionBody *this_00;
  uint32 local_30;
  uint32 local_2c;
  LONG col;
  ULONG line;
  
  if (statementIndex == 0xffffffff) {
    bVar1 = Func::IsJitInDebugMode(this->m_func);
    if (!bVar1) goto LAB_004c71ba;
  }
  else {
LAB_004c71ba:
    instr = IR::PragmaInstr::New(StatementBoundary,statementIndex,this->m_func);
    AddInstr(this,&instr->super_Instr,offset);
  }
  BVar2 = Func::HasTry(this->m_func->topFunc);
  if ((statementIndex == 0xffffffff) || (BVar2 != 0)) goto LAB_004c72b5;
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutFlag);
  if (bVar1) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar1 = JITTimeFunctionBody::IsLibraryCode(pJVar4);
    if (bVar1) goto LAB_004c722c;
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_00 = (FunctionBody *)JITTimeFunctionBody::GetAddr(pJVar4);
    byteCodeOffset = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
    bVar1 = Js::FunctionBody::GetLineCharOffset
                      (this_00,byteCodeOffset,&local_2c,(LONG *)&local_30,false);
    if (!bVar1) goto LAB_004c72b5;
    local_2c = local_2c + 1;
    bVar1 = Js::NumberPairSet::Contains((NumberPairSet *)&DAT_015aa318,local_2c,local_30);
    if (!bVar1) {
      bVar1 = Js::NumberPairSet::Contains((NumberPairSet *)&DAT_015aa318,local_2c,0xffffffff);
      goto LAB_004c723d;
    }
  }
  else {
LAB_004c722c:
    bVar1 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutAtEveryLineFlag);
LAB_004c723d:
    if (bVar1 == false) goto LAB_004c72b5;
  }
  InjectBailOut(this,offset);
LAB_004c72b5:
  uVar3 = Js::
          StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          ::MoveNextStatementBoundary(&this->m_statementReader);
  return uVar3;
}

Assistant:

uint
IRBuilder::AddStatementBoundary(uint statementIndex, uint offset)
{
    // Under debugger we use full stmt map, so that we know exactly start and end of each user stmt.
    // We insert additional instrs in between statements, such as ProfiledLoopStart, for these bytecode reader acts as
    // there is "unknown" stmt boundary with statementIndex == -1. Don't add stmt boundary for that as later
    // it may cause issues, e.g. see WinBlue 218307.
    if (!(statementIndex == Js::Constants::NoStatementIndex && this->m_func->IsJitInDebugMode()))
    {
        IR::PragmaInstr* pragmaInstr = IR::PragmaInstr::New(Js::OpCode::StatementBoundary, statementIndex, m_func);
        this->AddInstr(pragmaInstr, offset);
    }

#ifdef BAILOUT_INJECTION
    if (!this->m_func->IsOOPJIT())
    {
        // Don't inject bailout if the function have trys
        if (!this->m_func->GetTopFunc()->HasTry() && (statementIndex != Js::Constants::NoStatementIndex))
        {
            if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutFlag) && !this->m_func->GetJITFunctionBody()->IsLibraryCode())
            {
                ULONG line;
                LONG col;

                // Since we're on a separate thread, don't allow the line cache to be allocated in the Recycler.
                if (((Js::FunctionBody*)m_func->GetJITFunctionBody()->GetAddr())->GetLineCharOffset(this->m_jnReader.GetCurrentOffset(), &line, &col, false /*canAllocateLineCache*/))
                {
                    line++;
                    if (Js::Configuration::Global.flags.BailOut.Contains(line, (uint32)col) || Js::Configuration::Global.flags.BailOut.Contains(line, (uint32)-1))
                    {
                        this->InjectBailOut(offset);
                    }
                }
            }
            else if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryLineFlag)) 
            {
                this->InjectBailOut(offset);
            }
        }
    }
#endif
    return m_statementReader.MoveNextStatementBoundary();
}